

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::~SRGBTestCase(SRGBTestCase *this)

{
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  *this_00;
  pointer this_01;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  *this_02;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  *this_03;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  size_t __n_02;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SRGBTestCase_01e537b0;
  deinit(this);
  this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
             *)(this->m_shaderProgramList).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ::_M_deallocate(this_00,(pointer)((long)(this->m_shaderProgramList).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00 >> 3),__n);
  std::_Destroy<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters*>
            ((this->m_shaderParametersList).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_shaderParametersList).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this_01 = (this->m_shaderParametersList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
  ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                   *)this_01,
                  (pointer)((long)(this->m_shaderParametersList).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_01
                           >> 7),__n_00);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector
            (&this->m_textureResultList);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_renderBufferList).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  this_02 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
             *)(this->m_samplerList).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ::_M_deallocate(this_02,(pointer)((long)(this->m_samplerList).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_02 >> 3),__n_01);
  this_03 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
             *)(this->m_textureSourceList).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ::_M_deallocate(this_03,(pointer)((long)(this->m_textureSourceList).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_03 >> 3),__n_02);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase(&(this->m_framebuffer).
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               );
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

SRGBTestCase::~SRGBTestCase (void)
{
	deinit();
}